

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall
protozero::Message::AppendVarInt<perfetto::protos::gen::TrackEvent_LegacyEvent_InstantEventScope>
          (Message *this,uint32_t field_id,TrackEvent_LegacyEvent_InstantEventScope value)

{
  uint8_t *puVar1;
  uint8_t buffer [15];
  uint8_t local_2f [15];
  
  if (this->nested_message_ != (Message *)0x0) {
    EndNestedMessage(this);
  }
  puVar1 = proto_utils::WriteVarInt<unsigned_int>(field_id << 3,local_2f);
  puVar1 = proto_utils::WriteVarInt<perfetto::protos::gen::TrackEvent_LegacyEvent_InstantEventScope>
                     (value,puVar1);
  WriteToStream(this,local_2f,puVar1);
  return;
}

Assistant:

void AppendVarInt(uint32_t field_id, T value) {
    if (nested_message_)
      EndNestedMessage();

    uint8_t buffer[proto_utils::kMaxSimpleFieldEncodedSize];
    uint8_t* pos = buffer;

    pos = proto_utils::WriteVarInt(proto_utils::MakeTagVarInt(field_id), pos);
    // WriteVarInt encodes signed values in two's complement form.
    pos = proto_utils::WriteVarInt(value, pos);
    WriteToStream(buffer, pos);
  }